

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O0

Ptr express(TokenReader *tokens)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  bool bVar1;
  element_type *peVar2;
  invalid_argument *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  shared_ptr<SimpleASTNode> local_d8;
  shared_ptr<SimpleASTNode> local_c8;
  undefined4 local_b4;
  shared_ptr<SimpleASTNode> local_b0;
  undefined1 local_a0 [8];
  Ptr child2;
  undefined1 local_58 [8];
  Token token;
  undefined1 local_28 [8];
  Ptr child1;
  TokenReader *tokens_local;
  Ptr *node;
  
  orExpress((TokenReader *)local_28);
  token._39_1_ = 0;
  std::shared_ptr<SimpleASTNode>::shared_ptr
            ((shared_ptr<SimpleASTNode> *)tokens,(shared_ptr<SimpleASTNode> *)local_28);
  TokenReader::peek();
  bVar1 = std::operator!=((shared_ptr<SimpleASTNode> *)tokens,(nullptr_t)0x0);
  if (((bVar1) && (bVar1 = Token::isEmpty((Token *)local_58), !bVar1)) &&
     (local_58._0_4_ == ASSIGN_TYPE)) {
    TokenReader::read();
    this = &child2.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    Token::operator=((Token *)local_58,(Token *)this);
    Token::~Token((Token *)this);
    express((TokenReader *)local_a0);
    local_b4 = 3;
    SimpleASTNode::create((ASTNodeType *)&local_b0,(string *)&local_b4);
    std::shared_ptr<SimpleASTNode>::operator=((shared_ptr<SimpleASTNode> *)tokens,&local_b0);
    std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_b0);
    peVar2 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)tokens);
    std::shared_ptr<SimpleASTNode>::shared_ptr(&local_c8,(shared_ptr<SimpleASTNode> *)local_28);
    SimpleASTNode::addChild(peVar2,&local_c8);
    std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_c8);
    bVar1 = std::operator!=((shared_ptr<SimpleASTNode> *)local_a0,(nullptr_t)0x0);
    if (!bVar1) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"An valid expression is required!");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    peVar2 = std::__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)tokens);
    std::shared_ptr<SimpleASTNode>::shared_ptr(&local_d8,(shared_ptr<SimpleASTNode> *)local_a0);
    SimpleASTNode::addChild(peVar2,&local_d8);
    std::shared_ptr<SimpleASTNode>::~shared_ptr(&local_d8);
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_a0);
  }
  token._39_1_ = 1;
  Token::~Token((Token *)local_58);
  if ((token._39_1_ & 1) == 0) {
    std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)tokens);
  }
  std::shared_ptr<SimpleASTNode>::~shared_ptr((shared_ptr<SimpleASTNode> *)local_28);
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)tokens;
  return (Ptr)PVar3.super___shared_ptr<SimpleASTNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static SimpleASTNode::Ptr express(TokenReader& tokens)
{
    //std::cout << "in express" << std::endl;
    SimpleASTNode::Ptr child1 = orExpress(tokens);
    SimpleASTNode::Ptr node = child1;
    Token token = tokens.peek();
    if (node != nullptr && !token.isEmpty()) {
        if (token.type == TokenType::ASSIGN_TYPE) {
            token = tokens.read(); //consume "="
            SimpleASTNode::Ptr child2 = express(tokens);
            node = SimpleASTNode::create(ASTNodeType::ASSIGMENT, token.val);
            node->addChild(child1);
            if (child2 != nullptr)
                node->addChild(child2);
            else
                throw std::invalid_argument("An valid expression is required!");
        }
    }
    return node;
}